

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutCase.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::ssbo::SSBOLayoutCaseInstance::iterate
          (TestStatus *__return_storage_ptr__,SSBOLayoutCaseInstance *this)

{
  bool bVar1;
  deUint32 descriptorCount;
  int iVar2;
  DataType DVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  BufferBlock *pBVar10;
  BufferLayout *pBVar11;
  RefDataStorage *pRVar12;
  pointer pBVar13;
  pointer pBVar14;
  Allocation *pAVar15;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *this_00;
  TestLog *pTVar16;
  pointer pBVar17;
  bool bVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  Handle<(vk::HandleType)8> HVar21;
  Handle<(vk::HandleType)8> obj;
  Handle<(vk::HandleType)8> HVar22;
  VkDevice pVVar23;
  int iVar24;
  bool bVar25;
  bool bVar26;
  deUint32 queueFamilyIndex;
  uint uVar27;
  uint uVar28;
  VkResult VVar29;
  DataType scalarType;
  int numComps;
  uint uVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  DeviceInterface *vkd;
  VkDevice device;
  VkQueue pVVar34;
  void *pvVar35;
  deUint64 *pdVar36;
  InstanceInterface *pIVar37;
  VkPhysicalDevice pVVar38;
  uint *puVar39;
  undefined8 *puVar40;
  pointer pSVar41;
  const_iterator cVar42;
  long *plVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int *piVar48;
  ulong uVar49;
  int iVar50;
  void *pvVar51;
  uint uVar52;
  int iVar53;
  int iVar54;
  Deleter<vk::Handle<(vk::HandleType)8>_> *pDVar55;
  pointer pBVar56;
  void *ref;
  int iVar57;
  ulong uVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  long lVar63;
  long lVar64;
  int iVar65;
  int iVar66;
  ulong uVar67;
  size_type __n;
  long lVar68;
  BlockDataPtr BVar69;
  int local_b2c;
  ulong local_ad8;
  long *local_aa8;
  long local_aa0;
  long local_a98 [2];
  long *local_a88;
  long local_a80;
  long local_a78 [2];
  VkPipelineLayoutCreateInfo pipelineLayoutParams;
  VkSubmitInfo submitInfo;
  Move<vk::VkCommandBuffer_s_*> cmdBuffer;
  vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_> descriptors;
  deUint64 local_948;
  DeviceInterface *pDStack_940;
  VkDevice local_938;
  VkAllocationCallbacks *pVStack_930;
  DescriptorPoolBuilder poolBuilder;
  VkDescriptorSetLayout local_8b8;
  Deleter<vk::Handle<(vk::HandleType)19>_> DStack_8b0;
  Move<vk::Handle<(vk::HandleType)6>_> fence;
  Move<vk::Handle<(vk::HandleType)16>_> pipelineLayout;
  Deleter<vk::Handle<(vk::HandleType)21>_> DStack_850;
  VkDescriptorBufferInfo descriptorInfo;
  Move<vk::Handle<(vk::HandleType)24>_> cmdPool;
  Move<vk::Handle<(vk::HandleType)18>_> pipeline;
  Move<vk::Handle<(vk::HandleType)14>_> shaderModule;
  Move<vk::Handle<(vk::HandleType)8>_> acBuffer;
  DescriptorSetLayoutBuilder setLayoutBuilder;
  Move<vk::Handle<(vk::HandleType)8>_> buffer;
  ios_base local_6d0 [504];
  int local_4d8;
  DescriptorSetUpdateBuilder setUpdateBuilder;
  vector<void_*,_std::allocator<void_*>_> mapPtrs;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> alloc;
  VkDevice local_358;
  VkAllocationCallbacks *pVStack_350;
  ios_base local_2f8 [264];
  vector<int,_std::allocator<int>_> bufferSizes;
  ios_base local_180 [264];
  VkCommandBufferBeginInfo cmdBufBeginParams;
  VkDescriptorSetAllocateInfo allocInfo;
  
  vkd = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  pVVar34 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  createBuffer(&acBuffer,(this->super_TestInstance).m_context,0x400,0x20);
  allocateAndBindMemory
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&buffer,
             (this->super_TestInstance).m_context,
             (VkBuffer)
             acBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,
             (MemoryRequirement)0x1);
  HVar21 = buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object;
  memset(*(void **)(buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal +
                   0x18),0,0x400);
  ::vk::flushMappedMemoryRange
            (vkd,device,(VkDeviceMemory)*(deUint64 *)(HVar21.m_internal + 8),
             *(VkDeviceSize *)(HVar21.m_internal + 0x10),0x400);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder(&setLayoutBuilder);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder(&poolBuilder);
  uVar52 = 0;
  ::vk::DescriptorSetLayoutBuilder::addBinding
            (&setLayoutBuilder,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1,0x20,(VkSampler *)0x0);
  uVar27 = (uint)((ulong)((long)(this->m_interface->m_bufferBlocks).
                                super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->m_interface->m_bufferBlocks).
                               super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3);
  if (0 < (int)uVar27) {
    uVar67 = 0;
    uVar52 = 0;
    do {
      pBVar10 = (this->m_interface->m_bufferBlocks).
                super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar67];
      descriptorCount = pBVar10->m_arraySize;
      if ((int)descriptorCount < 1) {
        iVar59 = 1;
        ::vk::DescriptorSetLayoutBuilder::addBinding
                  (&setLayoutBuilder,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1,0x20,(VkSampler *)0x0);
      }
      else {
        ::vk::DescriptorSetLayoutBuilder::addBinding
                  (&setLayoutBuilder,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,descriptorCount,0x20,
                   (VkSampler *)0x0);
        iVar59 = pBVar10->m_arraySize;
      }
      uVar52 = uVar52 + iVar59;
      uVar67 = uVar67 + 1;
    } while ((uVar27 & 0x7fffffff) != uVar67);
  }
  ::vk::DescriptorPoolBuilder::addType(&poolBuilder,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,uVar52 + 1);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&buffer,&setLayoutBuilder,vkd,device,0);
  DStack_8b0.m_device = buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device
  ;
  DStack_8b0.m_allocator =
       buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
  local_8b8.m_internal =
       buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  DStack_8b0.m_deviceIface =
       buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface;
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&buffer,&poolBuilder,vkd,device,1,1);
  obj = buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object;
  DStack_850.m_device = buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device
  ;
  DStack_850.m_allocator =
       buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
  DStack_850.m_deviceIface =
       buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface;
  allocInfo.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO;
  allocInfo.pNext = (void *)0x0;
  allocInfo.descriptorPool.m_internal =
       buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  allocInfo.descriptorSetCount = 1;
  allocInfo.pSetLayouts = &local_8b8;
  ::vk::allocateDescriptorSet
            ((Move<vk::Handle<(vk::HandleType)22>_> *)&buffer,vkd,device,&allocInfo);
  local_938 = buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
  pVStack_930 = buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator;
  local_948 = buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  pDStack_940 = buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface;
  descriptorInfo.buffer.m_internal =
       acBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  descriptorInfo.offset = 0;
  descriptorInfo.range = 0x400;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder(&setUpdateBuilder);
  __n = (size_type)(int)uVar52;
  std::vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>::vector
            (&descriptors,__n,(allocator_type *)&buffer);
  ::vk::DescriptorSetUpdateBuilder::write(&setUpdateBuilder,(int)local_948,(void *)0x0,0);
  anon_unknown_15::computeBufferSizes(&bufferSizes,this->m_interface,this->m_refLayout);
  mapPtrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  mapPtrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  mapPtrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if ((int)uVar52 < 0) {
    std::__throw_length_error("cannot create std::vector larger than max_size()");
  }
  if (uVar52 == 0) {
    pvVar51 = (void *)0x0;
    pvVar35 = pvVar51;
  }
  else {
    pvVar35 = operator_new(__n * 0xc);
    memset(pvVar35,0,__n * 0xc);
    pvVar51 = (void *)(__n * 0xc + (long)pvVar35);
  }
  if (this->m_bufferMode == BUFFERMODE_PER_BLOCK) {
    std::vector<void_*,_std::allocator<void_*>_>::resize(&mapPtrs,__n);
    if (uVar52 != 0) {
      if ((int)uVar52 < 2) {
        uVar52 = 1;
      }
      lVar64 = 2;
      uVar67 = 0;
      do {
        uVar28 = bufferSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar67];
        *(int *)((long)pvVar35 + lVar64 * 4 + -8) = (int)uVar67;
        *(undefined4 *)((long)pvVar35 + lVar64 * 4 + -4) = 0;
        *(uint *)((long)pvVar35 + lVar64 * 4) = uVar28;
        createBuffer(&buffer,(this->super_TestInstance).m_context,(ulong)uVar28,0x20);
        allocateAndBindMemory
                  (&alloc,(this->super_TestInstance).m_context,
                   (VkBuffer)
                   buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,
                   (MemoryRequirement)0x1);
        *(deUint64 *)
         ((long)descriptors.
                super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar64 * 8 + -0x10) =
             buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
        *(undefined8 *)
         ((long)descriptors.
                super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar64 * 8 + -8) = 0;
        (&(descriptors.
           super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
           ._M_impl.super__Vector_impl_data._M_start)->buffer)[lVar64].m_internal = (ulong)uVar28;
        mapPtrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar67] =
             (alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr
             )->m_hostPtr;
        pdVar36 = (deUint64 *)operator_new(0x20);
        pdVar36[2] = (deUint64)
                     buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
        pdVar36[3] = (deUint64)
                     buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator
        ;
        *pdVar36 = buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
        pdVar36[1] = (deUint64)
                     buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                     m_deviceIface;
        buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
        buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
             (DeviceInterface *)0x0;
        buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device = (VkDevice)0x0
        ;
        buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
             (VkAllocationCallbacks *)0x0;
        submitInfo.pNext = (void *)0x0;
        submitInfo._0_8_ = pdVar36;
        submitInfo.pNext = operator_new(0x20);
        *(undefined4 *)((long)submitInfo.pNext + 8) = 0;
        *(undefined4 *)((long)submitInfo.pNext + 0xc) = 0;
        *(undefined ***)submitInfo.pNext = &PTR__SharedPtrState_00d1ddd0;
        *(deUint64 **)((long)submitInfo.pNext + 0x10) = pdVar36;
        *(undefined4 *)((long)submitInfo.pNext + 8) = 1;
        *(undefined4 *)((long)submitInfo.pNext + 0xc) = 1;
        std::
        vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>>>
        ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>>
                  ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>>>
                    *)&this->m_uniformBuffers,
                   (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_> *)&submitInfo
                  );
        if (submitInfo.pNext != (void *)0x0) {
          LOCK();
          piVar48 = (int *)((long)submitInfo.pNext + 8);
          *piVar48 = *piVar48 + -1;
          UNLOCK();
          if (*piVar48 == 0) {
            submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
            submitInfo._4_4_ = 0;
            (**(code **)(*submitInfo.pNext + 0x10))();
          }
          LOCK();
          piVar48 = (int *)((long)submitInfo.pNext + 0xc);
          *piVar48 = *piVar48 + -1;
          UNLOCK();
          if ((*piVar48 == 0) && (submitInfo.pNext != (void *)0x0)) {
            (**(code **)(*submitInfo.pNext + 8))();
          }
        }
        pAVar15 = alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
                  .ptr;
        alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
             (Allocation *)0x0;
        submitInfo.pNext = (void *)0x0;
        submitInfo._0_8_ = pAVar15;
        submitInfo.pNext = operator_new(0x20);
        *(undefined4 *)((long)submitInfo.pNext + 8) = 0;
        *(undefined4 *)((long)submitInfo.pNext + 0xc) = 0;
        *(undefined ***)submitInfo.pNext = &PTR__SharedPtrState_00d1fc38;
        *(Allocation **)((long)submitInfo.pNext + 0x10) = pAVar15;
        *(undefined4 *)((long)submitInfo.pNext + 8) = 1;
        *(undefined4 *)((long)submitInfo.pNext + 0xc) = 1;
        std::vector<de::SharedPtr<vk::Allocation>,std::allocator<de::SharedPtr<vk::Allocation>>>::
        emplace_back<de::SharedPtr<vk::Allocation>>
                  ((vector<de::SharedPtr<vk::Allocation>,std::allocator<de::SharedPtr<vk::Allocation>>>
                    *)&this->m_uniformAllocs,(SharedPtr<vk::Allocation> *)&submitInfo);
        if (submitInfo.pNext != (void *)0x0) {
          LOCK();
          piVar48 = (int *)((long)submitInfo.pNext + 8);
          *piVar48 = *piVar48 + -1;
          UNLOCK();
          if (*piVar48 == 0) {
            submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
            submitInfo._4_4_ = 0;
            (**(code **)(*submitInfo.pNext + 0x10))();
          }
          LOCK();
          piVar48 = (int *)((long)submitInfo.pNext + 0xc);
          *piVar48 = *piVar48 + -1;
          UNLOCK();
          if (*piVar48 == 0) {
            if (submitInfo.pNext != (void *)0x0) {
              (**(code **)(*submitInfo.pNext + 8))();
            }
            submitInfo.pNext = (void *)0x0;
          }
        }
        if (alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr
            != (Allocation *)0x0) {
          (*(alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)
            ->_vptr_Allocation[1])();
          alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
               (Allocation *)0x0;
        }
        if (buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                    (&buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
                     (VkBuffer)
                     buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal);
        }
        uVar67 = uVar67 + 1;
        lVar64 = lVar64 + 3;
      } while (uVar52 != uVar67);
    }
  }
  else {
    pIVar37 = Context::getInstanceInterface((this->super_TestInstance).m_context);
    pVVar38 = Context::getPhysicalDevice((this->super_TestInstance).m_context);
    (*pIVar37->_vptr_InstanceInterface[5])(pIVar37,pVVar38,&buffer);
    uVar67 = 0;
    if (uVar52 != 0) {
      uVar49 = 1;
      if (1 < (int)uVar52) {
        uVar49 = (ulong)uVar52;
      }
      piVar48 = (int *)((long)pvVar35 + 8);
      uVar58 = 0;
      do {
        iVar44 = (int)uVar67;
        iVar59 = bufferSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar58];
        if ((0 < local_4d8) && ((iVar44 / local_4d8) * local_4d8 != iVar44)) {
          iVar44 = (iVar44 / local_4d8 + 1) * local_4d8;
        }
        piVar48[-2] = 0;
        piVar48[-1] = iVar44;
        *piVar48 = iVar59;
        uVar28 = iVar44 + iVar59;
        uVar67 = (ulong)uVar28;
        uVar58 = uVar58 + 1;
        piVar48 = piVar48 + 3;
      } while (uVar49 != uVar58);
      uVar67 = (ulong)(int)uVar28;
    }
    createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&alloc,(this->super_TestInstance).m_context
                 ,uVar67,0x20);
    allocateAndBindMemory
              ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&submitInfo,
               (this->super_TestInstance).m_context,
               (VkBuffer)
               alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
               ptr,(MemoryRequirement)0x1);
    pipelineLayoutParams._0_8_ = *(undefined8 *)(submitInfo._0_8_ + 0x18);
    std::vector<void*,std::allocator<void*>>::emplace_back<void*>
              ((vector<void*,std::allocator<void*>> *)&mapPtrs,(void **)&pipelineLayoutParams);
    if (uVar52 != 0) {
      uVar67 = 1;
      if (1 < (int)uVar52) {
        uVar67 = (ulong)uVar52;
      }
      lVar64 = 0;
      puVar39 = (uint *)bufferSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
      do {
        uVar52 = *puVar39;
        uVar28 = *(uint *)((long)pvVar35 + lVar64 * 2 + 4);
        *(Allocation **)
         ((long)&((descriptors.
                   super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start)->buffer).m_internal + lVar64 * 4) =
             alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
        *(ulong *)((long)&(descriptors.
                           super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                           ._M_impl.super__Vector_impl_data._M_start)->offset + lVar64 * 4) =
             (ulong)uVar28;
        *(ulong *)((long)&(descriptors.
                           super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                           ._M_impl.super__Vector_impl_data._M_start)->range + lVar64 * 4) =
             (ulong)uVar52;
        puVar39 = puVar39 + 1;
        lVar64 = lVar64 + 6;
      } while (uVar67 * 6 != lVar64);
    }
    puVar40 = (undefined8 *)operator_new(0x20);
    puVar40[2] = local_358;
    puVar40[3] = pVStack_350;
    *puVar40 = alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
               ptr;
    puVar40[1] = alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                 _8_8_;
    alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
         (Allocation *)0x0;
    alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_ = 0;
    pipelineLayoutParams.pNext = (void *)0x0;
    pipelineLayoutParams._0_8_ = puVar40;
    pipelineLayoutParams.pNext = operator_new(0x20);
    *(undefined4 *)((long)pipelineLayoutParams.pNext + 8) = 0;
    *(undefined4 *)((long)pipelineLayoutParams.pNext + 0xc) = 0;
    *(undefined ***)pipelineLayoutParams.pNext = &PTR__SharedPtrState_00d1ddd0;
    *(undefined8 **)((long)pipelineLayoutParams.pNext + 0x10) = puVar40;
    *(undefined4 *)((long)pipelineLayoutParams.pNext + 8) = 1;
    *(undefined4 *)((long)pipelineLayoutParams.pNext + 0xc) = 1;
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>>>
    ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>>
              ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>>>>>
                *)&this->m_uniformBuffers,
               (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>_> *)
               &pipelineLayoutParams);
    if (pipelineLayoutParams.pNext != (void *)0x0) {
      LOCK();
      piVar48 = (int *)((long)pipelineLayoutParams.pNext + 8);
      *piVar48 = *piVar48 + -1;
      UNLOCK();
      if (*piVar48 == 0) {
        pipelineLayoutParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
        pipelineLayoutParams._4_4_ = 0;
        (**(code **)(*pipelineLayoutParams.pNext + 0x10))();
      }
      LOCK();
      piVar48 = (int *)((long)pipelineLayoutParams.pNext + 0xc);
      *piVar48 = *piVar48 + -1;
      UNLOCK();
      if ((*piVar48 == 0) && (pipelineLayoutParams.pNext != (void *)0x0)) {
        (**(code **)(*pipelineLayoutParams.pNext + 8))();
      }
    }
    uVar19 = submitInfo._0_8_;
    submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    submitInfo._4_4_ = 0;
    uVar20 = submitInfo._0_8_;
    pipelineLayoutParams.pNext = (void *)0x0;
    submitInfo.sType = (VkStructureType)uVar19;
    submitInfo._4_4_ = SUB84(uVar19,4);
    pipelineLayoutParams.sType = submitInfo.sType;
    pipelineLayoutParams._4_4_ = submitInfo._4_4_;
    submitInfo._0_8_ = uVar20;
    pipelineLayoutParams.pNext = operator_new(0x20);
    *(undefined4 *)((long)pipelineLayoutParams.pNext + 8) = 0;
    *(undefined4 *)((long)pipelineLayoutParams.pNext + 0xc) = 0;
    *(undefined ***)pipelineLayoutParams.pNext = &PTR__SharedPtrState_00d1fc38;
    *(undefined8 *)((long)pipelineLayoutParams.pNext + 0x10) = uVar19;
    *(undefined4 *)((long)pipelineLayoutParams.pNext + 8) = 1;
    *(undefined4 *)((long)pipelineLayoutParams.pNext + 0xc) = 1;
    std::vector<de::SharedPtr<vk::Allocation>,std::allocator<de::SharedPtr<vk::Allocation>>>::
    emplace_back<de::SharedPtr<vk::Allocation>>
              ((vector<de::SharedPtr<vk::Allocation>,std::allocator<de::SharedPtr<vk::Allocation>>>
                *)&this->m_uniformAllocs,(SharedPtr<vk::Allocation> *)&pipelineLayoutParams);
    if (pipelineLayoutParams.pNext != (void *)0x0) {
      LOCK();
      piVar48 = (int *)((long)pipelineLayoutParams.pNext + 8);
      *piVar48 = *piVar48 + -1;
      UNLOCK();
      if (*piVar48 == 0) {
        pipelineLayoutParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
        pipelineLayoutParams._4_4_ = 0;
        (**(code **)(*pipelineLayoutParams.pNext + 0x10))();
      }
      LOCK();
      piVar48 = (int *)((long)pipelineLayoutParams.pNext + 0xc);
      *piVar48 = *piVar48 + -1;
      UNLOCK();
      if (*piVar48 == 0) {
        if (pipelineLayoutParams.pNext != (void *)0x0) {
          (**(code **)(*pipelineLayoutParams.pNext + 8))();
        }
        pipelineLayoutParams.pNext = (void *)0x0;
      }
    }
    if (submitInfo._0_8_ != 0) {
      (**(code **)(*(long *)submitInfo._0_8_ + 8))();
      submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      submitInfo._4_4_ = 0;
    }
    if (alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr !=
        (Allocation *)0x0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)8>_> *)
                 &alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
                  .field_0x8,
                 (VkBuffer)
                 alloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                 ptr);
    }
  }
  if (0 < (int)uVar27) {
    uVar67 = 0;
    do {
      uVar67 = uVar67 + 1;
      ::vk::DescriptorSetUpdateBuilder::write
                (&setUpdateBuilder,(int)local_948,(void *)(uVar67 & 0xffffffff),0);
    } while ((uVar27 & 0x7fffffff) != uVar67);
  }
  pBVar11 = this->m_refLayout;
  std::vector<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_>::vector
            ((vector<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_> *)&buffer,
             ((long)pvVar51 - (long)pvVar35 >> 2) * -0x5555555555555555,(allocator_type *)&alloc);
  pBVar56 = (pBVar11->blocks).
            super__Vector_base<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(pBVar11->blocks).
                              super__Vector_base<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar56) >> 6)) {
    piVar48 = (int *)((long)pvVar35 + 8);
    lVar68 = 2;
    lVar64 = 0;
    lVar63 = 0;
    do {
      BVar69 = anon_unknown_15::getBlockDataPtr
                         (pBVar11,(BlockLayoutEntry *)
                                  ((long)&(pBVar56->name)._M_dataplus._M_p + lVar64),
                          (void *)((long)piVar48[-1] +
                                  (long)mapPtrs.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                        _M_impl.super__Vector_impl_data._M_start[piVar48[-2]]),
                          *piVar48);
      *(void **)((buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal - 8)
                + lVar68 * 4) = BVar69.ptr;
      *(long *)(buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal +
               lVar68 * 4) = BVar69._8_8_;
      lVar63 = lVar63 + 1;
      pBVar56 = (pBVar11->blocks).
                super__Vector_base<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar68 = lVar68 + 4;
      piVar48 = piVar48 + 3;
      lVar64 = lVar64 + 0x40;
    } while (lVar63 < (int)((ulong)((long)(pBVar11->blocks).
                                          super__Vector_base<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar56
                                   ) >> 6));
  }
  pVVar23 = buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
  HVar22.m_internal = buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  pBVar11 = this->m_refLayout;
  uVar52 = (uint)((ulong)((long)(pBVar11->blocks).
                                super__Vector_base<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pBVar11->blocks).
                               super__Vector_base<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 6);
  if (0 < (int)uVar52) {
    pRVar12 = this->m_initialData;
    uVar67 = 0;
    do {
      pBVar56 = (pBVar11->blocks).
                super__Vector_base<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pBVar13 = (pRVar12->pointers).
                super__Vector_base<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_>
                ._M_impl.super__Vector_impl_data._M_start;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&buffer,pBVar56[uVar67].name._M_dataplus._M_p,(allocator<char> *)&alloc);
      uVar27 = BufferLayout::getBlockIndex(pBVar11,(string *)&buffer);
      if ((VkDevice *)buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
          != &buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device) {
        operator_delete((void *)buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                                m_internal,
                        (ulong)(buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                                m_device + 1));
      }
      if (-1 < (int)uVar27) {
        piVar48 = *(int **)&pBVar56[uVar67].activeVarIndices.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl;
        if (piVar48 !=
            pBVar56[uVar67].activeVarIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          do {
            iVar59 = *piVar48;
            pBVar14 = (pBVar11->bufferVars).
                      super__Vector_base<vkt::ssbo::BufferVarLayoutEntry,_std::allocator<vkt::ssbo::BufferVarLayoutEntry>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&buffer,pBVar14[iVar59].name._M_dataplus._M_p,
                       (allocator<char> *)&alloc);
            uVar28 = BufferLayout::getVariableIndex(pBVar11,(string *)&buffer);
            if ((VkDevice *)
                buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal !=
                &buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device) {
              operator_delete((void *)buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                                      object.m_internal,
                              (ulong)(buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                                      deleter.m_device + 1));
            }
            if (-1 < (int)uVar28) {
              anon_unknown_15::copyBufferVarData
                        ((pBVar11->bufferVars).
                         super__Vector_base<vkt::ssbo::BufferVarLayoutEntry,_std::allocator<vkt::ssbo::BufferVarLayoutEntry>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar28,
                         (BlockDataPtr *)((ulong)uVar27 * 0x10 + HVar22.m_internal),pBVar14 + iVar59
                         ,pBVar13 + uVar67);
            }
            piVar48 = piVar48 + 1;
          } while (piVar48 !=
                   pBVar56[uVar67].activeVarIndices.super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
        }
      }
      uVar67 = uVar67 + 1;
    } while (uVar67 != (uVar52 & 0x7fffffff));
  }
  if (this->m_bufferMode == BUFFERMODE_PER_BLOCK) {
    pSVar41 = (this->m_uniformAllocs).
              super__Vector_base<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_uniformAllocs).
        super__Vector_base<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != pSVar41) {
      lVar64 = 0;
      uVar67 = 0;
      do {
        lVar63 = *(long *)((long)&pSVar41->m_ptr + lVar64);
        ::vk::flushMappedMemoryRange
                  (vkd,device,(VkDeviceMemory)*(deUint64 *)(lVar63 + 8),
                   *(VkDeviceSize *)(lVar63 + 0x10),
                   (long)bufferSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar67]);
        uVar67 = uVar67 + 1;
        pSVar41 = (this->m_uniformAllocs).
                  super__Vector_base<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar64 = lVar64 + 0x10;
      } while (uVar67 < (ulong)((long)(this->m_uniformAllocs).
                                      super__Vector_base<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar41 >>
                               4));
    }
  }
  else {
    uVar67 = 0;
    if ((long)bufferSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)bufferSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != 0) {
      lVar64 = (long)bufferSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)bufferSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2;
      lVar63 = 0;
      do {
        uVar52 = (int)uVar67 +
                 bufferSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar63];
        uVar67 = (ulong)uVar52;
        lVar63 = lVar63 + 1;
      } while (lVar64 + (ulong)(lVar64 == 0) != lVar63);
      uVar67 = (ulong)(int)uVar52;
    }
    pAVar15 = ((this->m_uniformAllocs).
               super__Vector_base<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->m_ptr;
    ::vk::flushMappedMemoryRange
              (vkd,device,(VkDeviceMemory)(pAVar15->m_memory).m_internal,pAVar15->m_offset,uVar67);
  }
  if (pvVar35 != (void *)0x0) {
    operator_delete(pvVar35,__n * 0xc);
  }
  if (mapPtrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(mapPtrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)mapPtrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)mapPtrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (bufferSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(bufferSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)bufferSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)bufferSizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  ::vk::DescriptorSetUpdateBuilder::update(&setUpdateBuilder,vkd,device);
  pipelineLayoutParams.sType = VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;
  pipelineLayoutParams.pNext = (void *)0x0;
  pipelineLayoutParams.flags = 0;
  pipelineLayoutParams.setLayoutCount = 1;
  pipelineLayoutParams.pSetLayouts = &local_8b8;
  pipelineLayoutParams.pushConstantRangeCount = 0;
  pipelineLayoutParams.pPushConstantRanges = (VkPushConstantRange *)0x0;
  ::vk::createPipelineLayout
            (&pipelineLayout,vkd,device,&pipelineLayoutParams,(VkAllocationCallbacks *)0x0);
  this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
             *)((this->super_TestInstance).m_context)->m_progCollection;
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
       (deUint64)&buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
  std::__cxx11::string::_M_construct<char_const*>((string *)&buffer,"compute","");
  cVar42 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(this_00,(key_type *)&buffer);
  ::vk::createShaderModule(&shaderModule,vkd,device,*(ProgramBinary **)(cVar42._M_node + 2),0);
  if ((VkDevice *)buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal !=
      &buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device) {
    operator_delete((void *)buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                            m_internal,
                    (ulong)(buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                            m_device + 1));
  }
  mapPtrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT44(mapPtrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                               super__Vector_impl_data._M_start._4_4_,0x1d);
  mapPtrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  mapPtrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)((ulong)mapPtrs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage & 0xffffffff00000000);
  ::vk::createComputePipeline
            (&pipeline,vkd,device,(VkPipelineCache)0x0,(VkComputePipelineCreateInfo *)&mapPtrs,
             (VkAllocationCallbacks *)0x0);
  ::vk::createCommandPool(&cmdPool,vkd,device,2,queueFamilyIndex,(VkAllocationCallbacks *)0x0);
  ::vk::allocateCommandBuffer
            (&cmdBuffer,vkd,device,
             (VkCommandPool)
             cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  cmdBufBeginParams.flags = 0;
  cmdBufBeginParams._20_4_ = 0;
  cmdBufBeginParams.pInheritanceInfo = (VkCommandBufferInheritanceInfo *)0x0;
  cmdBufBeginParams.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO;
  cmdBufBeginParams._4_4_ = 0;
  cmdBufBeginParams.pNext._0_4_ = 0;
  cmdBufBeginParams.pNext._4_4_ = 0;
  VVar29 = (*vkd->_vptr_DeviceInterface[0x49])
                     (vkd,cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  ::vk::checkResult(VVar29,"vk.beginCommandBuffer(*cmdBuffer, &cmdBufBeginParams)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/ssbo/vktSSBOLayoutCase.cpp"
                    ,0x844);
  (*vkd->_vptr_DeviceInterface[0x4c])
            (vkd,cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,1,
             pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
  (*vkd->_vptr_DeviceInterface[0x56])
            (vkd,cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,1,
             pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal,
             0,1,&local_948,0,0);
  (*vkd->_vptr_DeviceInterface[0x5d])
            (vkd,cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,1,1);
  VVar29 = (*vkd->_vptr_DeviceInterface[0x4a])
                     (vkd,cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  ::vk::checkResult(VVar29,"vk.endCommandBuffer(*cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/ssbo/vktSSBOLayoutCase.cpp"
                    ,0x84b);
  ::vk::createFence(&fence,vkd,device,0,(VkAllocationCallbacks *)0x0);
  submitInfo.pNext = (void *)0x0;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pSignalSemaphores = (VkSemaphore *)0x0;
  submitInfo.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.commandBufferCount = 1;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)&cmdBuffer;
  VVar29 = (*vkd->_vptr_DeviceInterface[2])
                     (vkd,pVVar34,1,&submitInfo,
                      fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal);
  ::vk::checkResult(VVar29,"vk.queueSubmit(queue, 1u, &submitInfo, *fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/ssbo/vktSSBOLayoutCase.cpp"
                    ,0x85c);
  VVar29 = (*vkd->_vptr_DeviceInterface[0x16])(vkd,device,1,&fence,1,0xffffffffffffffff);
  ::vk::checkResult(VVar29,"vk.waitForFences(device, 1u, &fence.get(), DE_TRUE, ~0ull)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/ssbo/vktSSBOLayoutCase.cpp"
                    ,0x85d);
  iVar59 = **(int **)(HVar21.m_internal + 0x18);
  if (iVar59 != 1) {
    buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
         (deUint64)((this->super_TestInstance).m_context)->m_testCtx->m_log;
    pDVar55 = &buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pDVar55);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pDVar55,"Error: ac_numPassed = ",0x16);
    std::ostream::operator<<(pDVar55,iVar59);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar55,", expected ",0xb);
    std::ostream::operator<<(pDVar55,1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&buffer,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pDVar55);
    std::ios_base::~ios_base(local_6d0);
  }
  pBVar11 = this->m_refLayout;
  uVar52 = (uint)((ulong)((long)(pBVar11->blocks).
                                super__Vector_base<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pBVar11->blocks).
                               super__Vector_base<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 6);
  if ((int)uVar52 < 1) {
    bVar18 = true;
  }
  else {
    pTVar16 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
    pRVar12 = this->m_writeData;
    bVar18 = true;
    uVar67 = 0;
    do {
      pBVar56 = (pBVar11->blocks).
                super__Vector_base<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pBVar13 = (pRVar12->pointers).
                super__Vector_base<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_>
                ._M_impl.super__Vector_impl_data._M_start;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&buffer,pBVar56[uVar67].name._M_dataplus._M_p,(allocator<char> *)&alloc);
      uVar27 = BufferLayout::getBlockIndex(pBVar11,(string *)&buffer);
      if ((VkDevice *)buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
          != &buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device) {
        operator_delete((void *)buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                                m_internal,
                        (ulong)(buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                                m_device + 1));
      }
      if (-1 < (int)uVar27) {
        piVar48 = *(int **)&pBVar56[uVar67].activeVarIndices.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl;
        if (piVar48 !=
            pBVar56[uVar67].activeVarIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          plVar43 = (long *)((ulong)uVar27 * 0x10 + HVar22.m_internal);
          do {
            iVar44 = *piVar48;
            pBVar14 = (pBVar11->bufferVars).
                      super__Vector_base<vkt::ssbo::BufferVarLayoutEntry,_std::allocator<vkt::ssbo::BufferVarLayoutEntry>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&buffer,pBVar14[iVar44].name._M_dataplus._M_p,
                       (allocator<char> *)&alloc);
            uVar27 = BufferLayout::getVariableIndex(pBVar11,(string *)&buffer);
            if ((VkDevice *)
                buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal !=
                &buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device) {
              operator_delete((void *)buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                                      object.m_internal,
                              (ulong)(buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                                      deleter.m_device + 1));
            }
            if (-1 < (int)uVar27) {
              pBVar14 = pBVar14 + iVar44;
              pBVar17 = (pBVar11->bufferVars).
                        super__Vector_base<vkt::ssbo::BufferVarLayoutEntry,_std::allocator<vkt::ssbo::BufferVarLayoutEntry>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              iVar44 = pBVar17[uVar27].offset;
              lVar64 = *plVar43;
              iVar2 = pBVar14->offset;
              pvVar35 = pBVar13[uVar67].ptr;
              scalarType = glu::getDataTypeScalarType(pBVar14->type);
              numComps = glu::getDataTypeScalarSize(pBVar17[uVar27].type);
              DVar3 = pBVar17[uVar27].type;
              uVar28 = *(uint *)((long)plVar43 + 0xc);
              uVar30 = pBVar17[uVar27].topLevelArraySize;
              if (pBVar17[uVar27].topLevelArraySize == 0) {
                uVar30 = uVar28;
              }
              if ((int)uVar30 < 1) {
                local_b2c = 0;
              }
              else {
                iVar4 = pBVar17[uVar27].arrayStride;
                iVar5 = pBVar17[uVar27].topLevelArrayStride;
                iVar6 = pBVar14->arrayStride;
                if (pBVar17[uVar27].arraySize != 0) {
                  uVar28 = pBVar17[uVar27].arraySize;
                }
                iVar7 = pBVar14->topLevelArrayStride;
                local_ad8 = 0;
                local_b2c = 0;
                do {
                  if (0 < (int)uVar28) {
                    iVar45 = (int)local_ad8;
                    uVar49 = 0;
                    do {
                      pDVar55 = &buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter
                      ;
                      iVar46 = (int)uVar49;
                      ref = (void *)((long)(iVar4 * iVar46) +
                                    (long)(iVar5 * iVar45) + iVar44 + lVar64);
                      pvVar51 = (void *)((long)pvVar35 +
                                        (long)(iVar6 * iVar46) +
                                        (long)(iVar7 * iVar45) + (long)iVar2);
                      iVar24 = local_b2c;
                      if (DVar3 - TYPE_FLOAT_MAT2 < 9 || DVar3 - TYPE_DOUBLE_MAT2 < 9) {
                        iVar31 = glu::getDataTypeMatrixNumRows(pBVar17[uVar27].type);
                        iVar32 = glu::getDataTypeMatrixNumColumns(pBVar17[uVar27].type);
                        if (0 < iVar32) {
                          bVar26 = pBVar17[uVar27].isRowMajor;
                          iVar8 = pBVar17[uVar27].matrixStride;
                          bVar1 = pBVar14->isRowMajor;
                          iVar9 = pBVar14->matrixStride;
                          bVar25 = true;
                          iVar54 = 0;
                          iVar66 = 0;
                          iVar62 = 0;
                          iVar57 = 0;
                          do {
                            iVar50 = iVar31;
                            iVar53 = iVar54;
                            iVar65 = iVar66;
                            iVar61 = iVar62;
                            iVar60 = iVar62;
                            if (0 < iVar31) {
                              do {
                                if (bVar25 == false) {
                                  bVar25 = false;
                                }
                                else {
                                  iVar33 = iVar53;
                                  if ((bVar1 & 1U) != 0) {
                                    iVar33 = iVar60;
                                  }
                                  iVar47 = iVar65;
                                  if ((bVar26 & 1U) != 0) {
                                    iVar47 = iVar61;
                                  }
                                  bVar25 = anon_unknown_15::compareComponents
                                                     (scalarType,(void *)((long)iVar47 + (long)ref),
                                                      (void *)((long)iVar33 + (long)pvVar51),1);
                                }
                                iVar61 = iVar61 + iVar8;
                                iVar65 = iVar65 + 4;
                                iVar53 = iVar53 + 4;
                                iVar60 = iVar60 + iVar9;
                                iVar50 = iVar50 + -1;
                              } while (iVar50 != 0);
                            }
                            iVar57 = iVar57 + 1;
                            iVar62 = iVar62 + 4;
                            iVar66 = iVar66 + iVar8;
                            iVar54 = iVar54 + iVar9;
                          } while (iVar57 != iVar32);
                          if (bVar25 == false) {
                            pDVar55 = &buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                                       deleter;
                            iVar24 = local_b2c + 1;
                            if (local_b2c + 1 < 3) {
                              std::__cxx11::ostringstream::ostringstream((ostringstream *)&alloc);
                              std::__cxx11::ostringstream::ostringstream
                                        ((ostringstream *)&bufferSizes);
                              anon_unknown_15::generateImmMatrixSrc
                                        ((ostream *)&alloc,pBVar14->type,pBVar14->matrixStride,
                                         pBVar14->isRowMajor,pvVar51);
                              anon_unknown_15::generateImmMatrixSrc
                                        ((ostream *)&bufferSizes,pBVar17[uVar27].type,
                                         pBVar17[uVar27].matrixStride,pBVar17[uVar27].isRowMajor,ref
                                        );
                              buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                              m_internal = (deUint64)pTVar16;
                              std::__cxx11::ostringstream::ostringstream((ostringstream *)pDVar55);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)pDVar55,"ERROR: mismatch in ",0x13);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)pDVar55,(pBVar14->name)._M_dataplus._M_p,
                                         (pBVar14->name)._M_string_length);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)pDVar55,", top-level ndx ",0x10);
                              std::ostream::operator<<(pDVar55,iVar45);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)pDVar55,", bottom-level ndx ",0x13);
                              std::ostream::operator<<(pDVar55,iVar46);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)pDVar55,":\n",2);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)pDVar55,"  expected ",0xb);
                              std::__cxx11::stringbuf::str();
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)pDVar55,(char *)local_a88,local_a80);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)pDVar55,"\n",1);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)pDVar55,"  got ",6);
                              std::__cxx11::stringbuf::str();
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)pDVar55,(char *)local_aa8,local_aa0);
                              tcu::MessageBuilder::operator<<
                                        ((MessageBuilder *)&buffer,
                                         (EndMessageToken *)&tcu::TestLog::EndMessage);
                              if (local_aa8 != local_a98) {
                                operator_delete(local_aa8,local_a98[0] + 1);
                              }
                              if (local_a88 != local_a78) {
                                operator_delete(local_a88,local_a78[0] + 1);
                              }
                              goto LAB_006b5126;
                            }
                          }
                        }
                      }
                      else {
                        bVar26 = anon_unknown_15::compareComponents(scalarType,ref,pvVar51,numComps)
                        ;
                        if ((!bVar26) && (iVar24 = local_b2c + 1, local_b2c + 1 < 3)) {
                          std::__cxx11::ostringstream::ostringstream((ostringstream *)&alloc);
                          std::__cxx11::ostringstream::ostringstream((ostringstream *)&bufferSizes);
                          anon_unknown_15::generateImmScalarVectorSrc
                                    ((ostream *)&alloc,pBVar14->type,pvVar51);
                          anon_unknown_15::generateImmScalarVectorSrc
                                    ((ostream *)&bufferSizes,pBVar17[uVar27].type,ref);
                          buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                          m_internal = (deUint64)pTVar16;
                          std::__cxx11::ostringstream::ostringstream((ostringstream *)pDVar55);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)pDVar55,"ERROR: mismatch in ",0x13);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)pDVar55,(pBVar14->name)._M_dataplus._M_p,
                                     (pBVar14->name)._M_string_length);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)pDVar55,", top-level ndx ",0x10);
                          std::ostream::operator<<(pDVar55,iVar45);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)pDVar55,", bottom-level ndx ",0x13);
                          std::ostream::operator<<(pDVar55,iVar46);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)pDVar55,":\n",2);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)pDVar55,"  expected ",0xb);
                          std::__cxx11::stringbuf::str();
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)pDVar55,(char *)local_a88,local_a80);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)pDVar55,"\n",1);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)pDVar55,"  got ",6);
                          std::__cxx11::stringbuf::str();
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)pDVar55,(char *)local_aa8,local_aa0);
                          tcu::MessageBuilder::operator<<
                                    ((MessageBuilder *)&buffer,
                                     (EndMessageToken *)&tcu::TestLog::EndMessage);
                          if (local_aa8 != local_a98) {
                            operator_delete(local_aa8,local_a98[0] + 1);
                          }
                          if (local_a88 != local_a78) {
                            operator_delete(local_a88,local_a78[0] + 1);
                          }
LAB_006b5126:
                          local_b2c = local_b2c + 1;
                          std::__cxx11::ostringstream::~ostringstream
                                    ((ostringstream *)
                                     &buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                                      deleter);
                          std::ios_base::~ios_base(local_6d0);
                          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&bufferSizes)
                          ;
                          std::ios_base::~ios_base(local_180);
                          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&alloc);
                          std::ios_base::~ios_base(local_2f8);
                          iVar24 = local_b2c;
                        }
                      }
                      local_b2c = iVar24;
                      uVar49 = uVar49 + 1;
                    } while (uVar49 != uVar28);
                  }
                  local_ad8 = local_ad8 + 1;
                } while (local_ad8 != uVar30);
              }
              pDVar55 = &buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter;
              if (2 < local_b2c) {
                buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
                     (deUint64)pTVar16;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)pDVar55);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar55,"... (",5);
                std::ostream::operator<<(pDVar55,local_b2c);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)pDVar55," failures for ",0xe);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)pDVar55,(pBVar14->name)._M_dataplus._M_p,
                           (pBVar14->name)._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)pDVar55," in total)",10);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)&buffer,(EndMessageToken *)&tcu::TestLog::EndMessage);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)pDVar55);
                std::ios_base::~ios_base(local_6d0);
              }
              if (local_b2c != 0) {
                bVar18 = false;
              }
            }
            piVar48 = piVar48 + 1;
          } while (piVar48 !=
                   pBVar56[uVar67].activeVarIndices.super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
        }
      }
      uVar67 = uVar67 + 1;
    } while (uVar67 != (uVar52 & 0x7fffffff));
  }
  if ((iVar59 == 1) && (bVar18)) {
    buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
         (deUint64)&buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&buffer,"Result comparison and counter values are OK","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,
               buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,
               (long)&(buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                      m_deviceIface)->_vptr_DeviceInterface +
               buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal);
  }
  else if (iVar59 == 1 && !bVar18) {
    buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
         (deUint64)&buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
    std::__cxx11::string::_M_construct<char_const*>((string *)&buffer,"Result comparison failed","")
    ;
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,
               buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,
               (long)&(buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                      m_deviceIface)->_vptr_DeviceInterface +
               buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal);
  }
  else {
    buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
         (deUint64)&buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device;
    if (bVar18 == true && iVar59 != 1) {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&buffer,"Counter value incorrect","");
      __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_description,
                 buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,
                 (long)&(buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                        m_deviceIface)->_vptr_DeviceInterface +
                 buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal);
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&buffer,"Result comparison and counter values are incorrect","");
      __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_description,
                 buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,
                 (long)&(buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                        m_deviceIface)->_vptr_DeviceInterface +
                 buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal);
    }
  }
  if ((VkDevice *)buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal !=
      &buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device) {
    operator_delete((void *)buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                            m_internal,
                    (ulong)(buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                            m_device + 1));
  }
  if (fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()
              (&fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter,
               (VkFence)fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal
              );
  }
  if (cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object != (VkCommandBuffer_s *)0x0) {
    buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal =
         (deUint64)cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
    (*(cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface)->
      _vptr_DeviceInterface[0x48])
              (cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface,
               cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device,
               cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal,1);
  }
  if (cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              (&cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter,
               (VkCommandPool)
               cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal);
  }
  if (pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              (&pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,
               (VkPipeline)
               pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
  }
  if (shaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              (&shaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter,
               (VkShaderModule)
               shaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal)
    ;
  }
  if (pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              (&pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter,
               (VkPipelineLayout)
               pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.
               m_internal);
  }
  if (HVar22.m_internal != 0) {
    operator_delete((void *)HVar22.m_internal,(long)pVVar23 - HVar22.m_internal);
  }
  if (descriptors.
      super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(descriptors.
                    super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)descriptors.
                          super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)descriptors.
                          super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (setUpdateBuilder.m_copies.
      super__Vector_base<vk::VkCopyDescriptorSet,_std::allocator<vk::VkCopyDescriptorSet>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(setUpdateBuilder.m_copies.
                    super__Vector_base<vk::VkCopyDescriptorSet,_std::allocator<vk::VkCopyDescriptorSet>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)setUpdateBuilder.m_copies.
                          super__Vector_base<vk::VkCopyDescriptorSet,_std::allocator<vk::VkCopyDescriptorSet>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)setUpdateBuilder.m_copies.
                          super__Vector_base<vk::VkCopyDescriptorSet,_std::allocator<vk::VkCopyDescriptorSet>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (setUpdateBuilder.m_writes.
      super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(setUpdateBuilder.m_writes.
                    super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)setUpdateBuilder.m_writes.
                          super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)setUpdateBuilder.m_writes.
                          super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ::~vector(&setUpdateBuilder.m_writeDescriptorInfos);
  if (local_948 != 0) {
    buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = local_948;
    (*pDStack_940->_vptr_DeviceInterface[0x3d])(pDStack_940,local_938,pVStack_930,1);
  }
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
              (&DStack_850,(VkDescriptorPool)obj.m_internal);
  }
  if (local_8b8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()(&DStack_8b0,local_8b8);
  }
  if (poolBuilder.m_counts.
      super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(poolBuilder.m_counts.
                    super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)poolBuilder.m_counts.
                          super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)poolBuilder.m_counts.
                          super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (setLayoutBuilder.m_immutableSamplers.
      super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(setLayoutBuilder.m_immutableSamplers.
                    super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)setLayoutBuilder.m_immutableSamplers.
                          super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)setLayoutBuilder.m_immutableSamplers.
                          super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (setLayoutBuilder.m_immutableSamplerInfos.
      super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(setLayoutBuilder.m_immutableSamplerInfos.
                    super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)setLayoutBuilder.m_immutableSamplerInfos.
                          super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)setLayoutBuilder.m_immutableSamplerInfos.
                          super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (setLayoutBuilder.m_bindings.
      super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(setLayoutBuilder.m_bindings.
                    super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)setLayoutBuilder.m_bindings.
                          super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)setLayoutBuilder.m_bindings.
                          super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (HVar21.m_internal != 0) {
    (**(code **)(*(long *)HVar21.m_internal + 8))();
  }
  if (acBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&acBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               acBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus SSBOLayoutCaseInstance::iterate (void)
{
	// todo: add compute stage availability check
	const vk::DeviceInterface&	vk					= m_context.getDeviceInterface();
	const vk::VkDevice			device				= m_context.getDevice();
	const vk::VkQueue			queue				= m_context.getUniversalQueue();
	const deUint32				queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();

	// Create descriptor set
	const deUint32 acBufferSize = 1024;
	vk::Move<vk::VkBuffer> acBuffer (createBuffer(m_context, acBufferSize, vk:: VK_BUFFER_USAGE_STORAGE_BUFFER_BIT));
	de::UniquePtr<vk::Allocation> acBufferAlloc (allocateAndBindMemory(m_context, *acBuffer, vk::MemoryRequirement::HostVisible));

	deMemset(acBufferAlloc->getHostPtr(), 0, acBufferSize);
	flushMappedMemoryRange(vk, device, acBufferAlloc->getMemory(), acBufferAlloc->getOffset(), acBufferSize);

	vk::DescriptorSetLayoutBuilder setLayoutBuilder;
	vk::DescriptorPoolBuilder poolBuilder;

	setLayoutBuilder
		.addSingleBinding(vk::VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, vk::VK_SHADER_STAGE_COMPUTE_BIT);

	int numBlocks = 0;
	const int numBindings = m_interface.getNumBlocks();
	for (int bindingNdx = 0; bindingNdx < numBindings; bindingNdx++)
	{
		const BufferBlock& block = m_interface.getBlock(bindingNdx);
		if (block.isArray())
		{
			setLayoutBuilder
				.addArrayBinding(vk::VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, block.getArraySize(), vk::VK_SHADER_STAGE_COMPUTE_BIT);
			numBlocks += block.getArraySize();
		}
		else
		{
			setLayoutBuilder
				.addSingleBinding(vk::VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, vk::VK_SHADER_STAGE_COMPUTE_BIT);
			numBlocks += 1;
		}
	}

	poolBuilder
		.addType(vk::VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, (deUint32)(1 + numBlocks));

	const vk::Unique<vk::VkDescriptorSetLayout> descriptorSetLayout(setLayoutBuilder.build(vk, device));
	const vk::Unique<vk::VkDescriptorPool> descriptorPool(poolBuilder.build(vk, device, vk::VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const vk::VkDescriptorSetAllocateInfo allocInfo =
	{
		vk::VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO,
		DE_NULL,
		*descriptorPool,
		1u,
		&descriptorSetLayout.get(),
	};

	const vk::Unique<vk::VkDescriptorSet> descriptorSet(allocateDescriptorSet(vk, device, &allocInfo));
	const vk::VkDescriptorBufferInfo descriptorInfo = makeDescriptorBufferInfo(*acBuffer, 0ull, acBufferSize);

	vk::DescriptorSetUpdateBuilder setUpdateBuilder;
	std::vector<vk::VkDescriptorBufferInfo>	descriptors(numBlocks);

	setUpdateBuilder
		.writeSingle(*descriptorSet, vk::DescriptorSetUpdateBuilder::Location::binding(0u), vk::VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &descriptorInfo);

	vector<BlockDataPtr>  mappedBlockPtrs;

	// Upload base buffers
	{
		const std::vector<int>			bufferSizes		= computeBufferSizes(m_interface, m_refLayout);
		std::vector<void*>				mapPtrs;
		std::vector<BlockLocation>		blockLocations	(numBlocks);

		DE_ASSERT(bufferSizes.size() == m_refLayout.blocks.size());

		if (m_bufferMode == SSBOLayoutCase::BUFFERMODE_PER_BLOCK)
		{
			mapPtrs.resize(numBlocks);
			for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
			{
				const deUint32 bufferSize = bufferSizes[blockNdx];
				DE_ASSERT(bufferSize > 0);

				blockLocations[blockNdx] = BlockLocation(blockNdx, 0, bufferSize);

				vk::Move<vk::VkBuffer>				buffer		= createBuffer(m_context, bufferSize, vk::VK_BUFFER_USAGE_STORAGE_BUFFER_BIT);
				de::MovePtr<vk::Allocation>			alloc		= allocateAndBindMemory(m_context, *buffer, vk::MemoryRequirement::HostVisible);

				descriptors[blockNdx] = makeDescriptorBufferInfo(*buffer, 0ull, bufferSize);

				mapPtrs[blockNdx] = alloc->getHostPtr();

				m_uniformBuffers.push_back(VkBufferSp(new vk::Unique<vk::VkBuffer>(buffer)));
				m_uniformAllocs.push_back(AllocationSp(alloc.release()));
			}
		}
		else
		{
			DE_ASSERT(m_bufferMode == SSBOLayoutCase::BUFFERMODE_SINGLE);

			vk::VkPhysicalDeviceProperties properties;
			m_context.getInstanceInterface().getPhysicalDeviceProperties(m_context.getPhysicalDevice(), &properties);
			const int	bindingAlignment	= (int)properties.limits.minStorageBufferOffsetAlignment;
			int			curOffset			= 0;
			for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
			{
				const int bufferSize = bufferSizes[blockNdx];
				DE_ASSERT(bufferSize > 0);

				if (bindingAlignment > 0)
					curOffset = deRoundUp32(curOffset, bindingAlignment);

				blockLocations[blockNdx] = BlockLocation(0, curOffset, bufferSize);
				curOffset += bufferSize;
			}

			const int						totalBufferSize = curOffset;
			vk::Move<vk::VkBuffer>			buffer			= createBuffer(m_context, totalBufferSize, vk::VK_BUFFER_USAGE_STORAGE_BUFFER_BIT);
			de::MovePtr<vk::Allocation>		alloc			= allocateAndBindMemory(m_context, *buffer, vk::MemoryRequirement::HostVisible);

			mapPtrs.push_back(alloc->getHostPtr());

			for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
			{
				const deUint32						bufferSize	= bufferSizes[blockNdx];
				const deUint32						offset		= blockLocations[blockNdx].offset;

				descriptors[blockNdx] = makeDescriptorBufferInfo(*buffer, offset, bufferSize);
			}

			m_uniformBuffers.push_back(VkBufferSp(new vk::Unique<vk::VkBuffer>(buffer)));
			m_uniformAllocs.push_back(AllocationSp(alloc.release()));
		}

		// Update remaining bindings
		{
			int blockNdx = 0;
			for (int bindingNdx = 0; bindingNdx < numBindings; ++bindingNdx)
			{
				const BufferBlock&	block				= m_interface.getBlock(bindingNdx);
				const int			numBlocksInBinding	= (block.isArray() ? block.getArraySize() : 1);

				setUpdateBuilder.writeArray(*descriptorSet, vk::DescriptorSetUpdateBuilder::Location::binding(bindingNdx + 1),
					vk::VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, numBlocksInBinding, &descriptors[blockNdx]);

				blockNdx += numBlocksInBinding;
			}
		}

		// Copy the initial data to the storage buffers
		{
			mappedBlockPtrs = blockLocationsToPtrs(m_refLayout, blockLocations, mapPtrs);
			copyData(m_refLayout, mappedBlockPtrs, m_refLayout, m_initialData.pointers);

			if (m_bufferMode == SSBOLayoutCase::BUFFERMODE_PER_BLOCK)
			{
				DE_ASSERT(m_uniformAllocs.size() == bufferSizes.size());
				for (size_t allocNdx = 0; allocNdx < m_uniformAllocs.size(); allocNdx++)
				{
					const int size = bufferSizes[allocNdx];
					vk::Allocation* alloc = m_uniformAllocs[allocNdx].get();
					flushMappedMemoryRange(vk, device, alloc->getMemory(), alloc->getOffset(), size);
				}
			}
			else
			{
				DE_ASSERT(m_bufferMode == SSBOLayoutCase::BUFFERMODE_SINGLE);
				DE_ASSERT(m_uniformAllocs.size() == 1);
				int totalSize = 0;
				for (size_t bufferNdx = 0; bufferNdx < bufferSizes.size(); bufferNdx++)
				{
					totalSize += bufferSizes[bufferNdx];
				}

				DE_ASSERT(totalSize > 0);
				vk::Allocation* alloc = m_uniformAllocs[0].get();
				flushMappedMemoryRange(vk, device, alloc->getMemory(), alloc->getOffset(), totalSize);
			}
		}
	}

	setUpdateBuilder.update(vk, device);

	const vk::VkPipelineLayoutCreateInfo pipelineLayoutParams =
	{
		vk::VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO,	// VkStructureType				sType;
		DE_NULL,											// const void*					pNext;
		(vk::VkPipelineLayoutCreateFlags)0,
		1u,													// deUint32						descriptorSetCount;
		&*descriptorSetLayout,								// const VkDescriptorSetLayout*	pSetLayouts;
		0u,													// deUint32						pushConstantRangeCount;
		DE_NULL,											// const VkPushConstantRange*	pPushConstantRanges;
	};
	vk::Move<vk::VkPipelineLayout> pipelineLayout(createPipelineLayout(vk, device, &pipelineLayoutParams));

	vk::Move<vk::VkShaderModule> shaderModule (createShaderModule(vk, device, m_context.getBinaryCollection().get("compute"), 0));
	const vk::VkPipelineShaderStageCreateInfo pipelineShaderStageParams =
	{
		vk::VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,// VkStructureType				sType;
		DE_NULL,												// const void*					pNext;
		(vk::VkPipelineShaderStageCreateFlags)0,
		vk::VK_SHADER_STAGE_COMPUTE_BIT,						// VkShaderStage				stage;
		*shaderModule,											// VkShader						shader;
		"main",													//
		DE_NULL,												// const VkSpecializationInfo*	pSpecializationInfo;
	};
	const vk::VkComputePipelineCreateInfo pipelineCreateInfo =
	{
		vk::VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO,	// VkStructureType					sType;
		DE_NULL,											// const void*						pNext;
		0,													// VkPipelineCreateFlags			flags;
		pipelineShaderStageParams,							// VkPipelineShaderStageCreateInfo	stage;
		*pipelineLayout,									// VkPipelineLayout					layout;
		DE_NULL,											// VkPipeline						basePipelineHandle;
		0,													// deInt32							basePipelineIndex;
	};
	vk::Move<vk::VkPipeline> pipeline(createComputePipeline(vk, device, DE_NULL, &pipelineCreateInfo));

	vk::Move<vk::VkCommandPool> cmdPool (createCommandPool(vk, device, vk::VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
	vk::Move<vk::VkCommandBuffer> cmdBuffer (allocateCommandBuffer(vk, device, *cmdPool, vk::VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	const vk::VkCommandBufferBeginInfo cmdBufBeginParams =
	{
		vk::VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,	//	VkStructureType				sType;
		DE_NULL,											//	const void*					pNext;
		0u,													//	VkCmdBufferOptimizeFlags	flags;
		(const vk::VkCommandBufferInheritanceInfo*)DE_NULL,
	};
	VK_CHECK(vk.beginCommandBuffer(*cmdBuffer, &cmdBufBeginParams));

	vk.cmdBindPipeline(*cmdBuffer, vk::VK_PIPELINE_BIND_POINT_COMPUTE, *pipeline);
	vk.cmdBindDescriptorSets(*cmdBuffer, vk::VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);

	vk.cmdDispatch(*cmdBuffer, 1, 1, 1);

	VK_CHECK(vk.endCommandBuffer(*cmdBuffer));

	vk::Move<vk::VkFence> fence (createFence(vk, device));

	const vk::VkSubmitInfo  submitInfo  =
	{
		vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,
		DE_NULL,
		0u,
		(const vk::VkSemaphore*)DE_NULL,
		(const vk::VkPipelineStageFlags*)DE_NULL,
		1u,
		&cmdBuffer.get(),
		0u,
		(const vk::VkSemaphore*)DE_NULL,
	};

	VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo, *fence));
	VK_CHECK(vk.waitForFences(device, 1u, &fence.get(), DE_TRUE, ~0ull));

	// Read back ac_numPassed data
	bool counterOk;
	{
		const int refCount = 1;
		int resCount = 0;

		resCount = *(const int*)((const deUint8*)acBufferAlloc->getHostPtr());

		counterOk = (refCount == resCount);
		if (!counterOk)
		{
			m_context.getTestContext().getLog() << TestLog::Message << "Error: ac_numPassed = " << resCount << ", expected " << refCount << TestLog::EndMessage;
		}
	}

	// Validate result
	const bool compareOk = compareData(m_context.getTestContext().getLog(), m_refLayout, m_writeData.pointers, m_refLayout, mappedBlockPtrs);

	if (compareOk && counterOk)
		return tcu::TestStatus::pass("Result comparison and counter values are OK");
	else if (!compareOk && counterOk)
		return tcu::TestStatus::fail("Result comparison failed");
	else if (compareOk && !counterOk)
		return tcu::TestStatus::fail("Counter value incorrect");
	else
		return tcu::TestStatus::fail("Result comparison and counter values are incorrect");
}